

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System_test.cc
# Opt level: O3

void __thiscall
CounterSystem::update(CounterSystem *this,EntityManager *es,EventManager *events,TimeDelta param_3)

{
  int *piVar1;
  ulong *puVar2;
  long lVar3;
  ComponentMask CVar4;
  Family FVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ComponentHandle<Counter,_entityx::EntityManager> CVar10;
  View<Counter> entities;
  Iterator __end1;
  BaseView<false> local_68;
  Iterator local_58;
  
  CVar4 = entityx::EntityManager::component_mask<Counter>(es);
  puVar2 = *(ulong **)(es + 0x48);
  uVar9 = (long)*(ulong **)(es + 0x50) - (long)puVar2 >> 3;
  uVar8 = 0;
  if ((*(ulong **)(es + 0x50) != puVar2) &&
     (((ulong)CVar4.super__Base_bitset<1UL>._M_w & ~*puVar2) != 0)) {
    uVar7 = 1;
    do {
      uVar8 = (ulong)uVar7;
      uVar6 = (ulong)uVar7;
      if (uVar9 <= uVar6) break;
      uVar7 = uVar7 + 1;
    } while (((ulong)CVar4.super__Base_bitset<1UL>._M_w & ~puVar2[uVar6]) != 0);
  }
  local_68.manager_ = es;
  local_68.mask_ = CVar4;
  entityx::EntityManager::BaseView<false>::end(&local_58,&local_68);
  if ((uint32_t)uVar8 !=
      local_58.super_ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>.i_) {
    do {
      CVar10 = entityx::EntityManager::component<Counter,void>
                         (es,(Id)((ulong)*(uint *)(*(long *)(es + 0x60) + uVar8 * 4) << 0x20 | uVar8
                                 ));
      FVar5 = entityx::Component<Counter>::family();
      lVar3 = *(long *)(*(long *)(CVar10.manager_ + 0x18) + FVar5 * 8);
      uVar6 = CVar10.id_.id_.id_ & 0xffffffff;
      piVar1 = (int *)(*(long *)(*(long *)(lVar3 + 8) + (uVar6 / *(ulong *)(lVar3 + 0x28)) * 8) +
                      (uVar6 % *(ulong *)(lVar3 + 0x28)) * *(long *)(lVar3 + 0x20));
      *piVar1 = *piVar1 + 1;
      uVar8 = (ulong)((int)uVar8 + 1);
      if (uVar8 < uVar9) {
        do {
          if (((ulong)CVar4.super__Base_bitset<1UL>._M_w &
              ~*(ulong *)(*(long *)(es + 0x48) + uVar8 * 8)) == 0) break;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < uVar9);
      }
    } while ((uint32_t)uVar8 !=
             local_58.super_ViewIterator<entityx::EntityManager::BaseView<false>::Iterator,_false>.
             i_);
  }
  return;
}

Assistant:

void update(EntityManager &es, EventManager &events, TimeDelta) override {
    auto entities = es.entities_with_components<Counter>();
    Counter::Handle counter;
    for (auto entity : entities) {
      entity.unpack<Counter>(counter);
      counter->counter++;
    }
  }